

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O0

ProcessLocation * __thiscall
pstack::Procman::StackFrame::scopeIP
          (ProcessLocation *__return_storage_ptr__,StackFrame *this,Process *proc)

{
  CIE *pCVar1;
  CIE *lcie;
  ProcessLocation location;
  Addr raw;
  Process *proc_local;
  StackFrame *this_local;
  
  location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)rawIP(this);
  if (location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ProcessLocation::ProcessLocation(__return_storage_ptr__,proc,0);
  }
  else if (this->mechanism == MACHINEREGS) {
    ProcessLocation::ProcessLocation
              (__return_storage_ptr__,proc,
               (Addr)location.codeloc.
                     super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  }
  else if ((this->isSignalTrampoline & 1U) == 0) {
    ProcessLocation::ProcessLocation
              ((ProcessLocation *)&lcie,proc,
               (Addr)location.codeloc.
                     super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
    pCVar1 = ProcessLocation::cie((ProcessLocation *)&lcie);
    if ((pCVar1 == (CIE *)0x0) || (((byte)pCVar1[0xd] & 1) == 0)) {
      ProcessLocation::ProcessLocation
                (__return_storage_ptr__,proc,
                 (Addr)((long)&location.codeloc.
                               super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi[-1]._M_weak_count + 3));
    }
    else {
      ProcessLocation::ProcessLocation(__return_storage_ptr__,(ProcessLocation *)&lcie);
    }
    ProcessLocation::~ProcessLocation((ProcessLocation *)&lcie);
  }
  else {
    ProcessLocation::ProcessLocation
              (__return_storage_ptr__,proc,
               (Addr)location.codeloc.
                     super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

ProcessLocation
StackFrame::scopeIP(Process &proc) const
{
    // For a return address on the stack, it normally represents the next
    // instruction after a call. For functions that don't return, this might
    // land outside the caller function - so we subtract one, putting us in the
    // middle of the call instruction. This will also improve source line
    // details, as the actual return address is likely on the line of code
    // *after* the call rather than at it.
    //
    // There are two exceptions: first, the instruction pointer we grab from
    // the process's register state - this is the currently executing
    // instruction, so accurately reflects the position in the top stack frame.
    //
    // The other is for signal trampolines - In this case, the return address
    // has been synthesized to be the entrypoint of a function (eg,
    // __restore_rt) to handle return from the signal handler, and will be the
    // first instruction in the function - there's no previous call instruction
    // to point at, so we use it directly.
    auto raw = rawIP();
    if (raw == 0)
       return { proc, raw };
    if (mechanism == UnwindMechanism::MACHINEREGS)
       return { proc, raw };
    if (isSignalTrampoline)
       return { proc, raw };
    ProcessLocation location(proc, raw);

    const auto *lcie = location.cie();
    if (lcie != nullptr && lcie->isSignalHandler)
       return location;
    return {proc, raw - 1};
}